

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_ftyp_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *__s;
  char *fmt;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  if (jp2->jp2_state == 1) {
    if (7 < p_header_size) {
      opj_read_bytes_LE(p_header_data,&jp2->brand,4);
      opj_read_bytes_LE(p_header_data + 4,&jp2->minversion,4);
      if ((p_header_size & 3) == 0) {
        uVar1 = p_header_size - 8;
        jp2->numcl = uVar1 >> 2;
        if (uVar1 != 0) {
          __s = (OPJ_UINT32 *)malloc((ulong)uVar1);
          jp2->cl = __s;
          if (__s == (OPJ_UINT32 *)0x0) {
            fmt = "Not enough memory with FTYP Box\n";
            goto LAB_001f6ea8;
          }
          memset(__s,0,(ulong)uVar1);
        }
        if (jp2->numcl != 0) {
          lVar3 = 0;
          uVar2 = 0;
          do {
            opj_read_bytes_LE(p_header_data + lVar3 + 8,(OPJ_UINT32 *)((long)jp2->cl + lVar3),4);
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 4;
          } while (uVar2 < jp2->numcl);
        }
        *(byte *)&jp2->jp2_state = (byte)jp2->jp2_state | 2;
        return 1;
      }
    }
    fmt = "Error with FTYP signature Box size\n";
  }
  else {
    fmt = "The ftyp box must be the second box in the file.\n";
  }
LAB_001f6ea8:
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool jp2_read_ftyp_v2(
							opj_jp2_v2_t *jp2,
							unsigned char * p_header_data,
							unsigned int p_header_size,
							opj_event_mgr_t * p_manager
						)
{
	OPJ_UINT32 i, l_remaining_bytes;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if (jp2->jp2_state != JP2_STATE_SIGNATURE) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The ftyp box must be the second box in the file.\n");
		return OPJ_FALSE;
	}

	/* assure length of data is correct */
	if (p_header_size < 8) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&jp2->brand,4);		/* BR */
	p_header_data += 4;

	opj_read_bytes(p_header_data,&jp2->minversion,4);		/* MinV */
	p_header_data += 4;

	l_remaining_bytes = p_header_size - 8;

	/* the number of remaining bytes should be a multiple of 4 */
	if ((l_remaining_bytes & 0x3) != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
		return OPJ_FALSE;
	}

	/* div by 4 */
	jp2->numcl = l_remaining_bytes >> 2;
	if (jp2->numcl) {
		jp2->cl = (unsigned int *) opj_malloc(jp2->numcl * sizeof(unsigned int));
		if (jp2->cl == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory with FTYP Box\n");
			return OPJ_FALSE;
		}
		memset(jp2->cl,0,jp2->numcl * sizeof(unsigned int));
	}

	for (i = 0; i < jp2->numcl; ++i)
	{
		opj_read_bytes(p_header_data,&jp2->cl[i],4);		/* CLi */
		p_header_data += 4;
	}

	jp2->jp2_state |= JP2_STATE_FILE_TYPE;

	return OPJ_TRUE;
}